

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O2

Result joypad_read(FileData *file_data,JoypadBuffer **out_buffer)

{
  u8 *puVar1;
  ulong uVar2;
  long lVar3;
  Result RVar4;
  long lVar5;
  JoypadBuffer *pJVar6;
  JoypadChunk *pJVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong capacity;
  
  if ((file_data->size & 0xf) == 0) {
    capacity = file_data->size >> 4;
    lVar5 = 9;
    uVar10 = 0;
    for (uVar8 = 0; uVar8 != capacity; uVar8 = uVar8 + 1) {
      puVar1 = file_data->data;
      uVar2 = *(ulong *)(puVar1 + uVar8 * 0x10);
      if (uVar2 < uVar10) {
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",0xf0
               );
        fprintf(_stderr,"Expected ticks to be sorted, got %lu then %lu\n",uVar10,uVar2);
        goto LAB_0010d7b5;
      }
      lVar9 = -7;
      while (lVar9 != 0) {
        lVar3 = lVar9 + lVar5 + 7;
        lVar9 = lVar9 + 1;
        if (puVar1[lVar3] != '\0') {
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",
                  0xf4);
          fprintf(_stderr,"Expected padding to be zero, got %u\n",(ulong)puVar1[uVar8 * 0x11 + 9]);
          goto LAB_0010d7b5;
        }
      }
      lVar5 = lVar5 + 0x10;
      uVar10 = uVar2;
    }
    pJVar6 = (JoypadBuffer *)calloc(1,0x48);
    pJVar7 = alloc_joypad_chunk(capacity);
    memcpy(pJVar7->data,file_data->data,file_data->size);
    pJVar7->size = capacity;
    pJVar7->next = (JoypadChunk *)pJVar6;
    pJVar7->prev = (JoypadChunk *)pJVar6;
    (pJVar6->sentinel).next = pJVar7;
    (pJVar6->sentinel).prev = pJVar7;
    *out_buffer = pJVar6;
    RVar4 = OK;
  }
  else {
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",0xe7);
    fprintf(_stderr,"Expected joypad file size to be multiple of %zu\n",0x10);
LAB_0010d7b5:
    RVar4 = ERROR;
  }
  return RVar4;
}

Assistant:

Result joypad_read(const FileData* file_data, JoypadBuffer** out_buffer) {
  CHECK_MSG(file_data->size % sizeof(JoypadState) == 0,
            "Expected joypad file size to be multiple of %zu\n",
            sizeof(JoypadState));
  size_t size = file_data->size / sizeof(JoypadState);
  size_t i;
  Ticks last_ticks = 0;
  for (i = 0; i < size; ++i) {
    JoypadState* state = (JoypadState*)file_data->data + i;
    Ticks ticks = state->ticks;
    CHECK_MSG(ticks >= last_ticks,
              "Expected ticks to be sorted, got %" PRIu64 " then %" PRIu64 "\n",
              last_ticks, ticks);
    size_t j;
    for (j = 0; j < ARRAY_SIZE(state->padding); ++j) {
      CHECK_MSG(state->padding[j] == 0, "Expected padding to be zero, got %u\n",
                state->padding[i]);
    }
    last_ticks = ticks;
  }

  JoypadBuffer* buffer = xcalloc(1, sizeof(JoypadBuffer));
  JoypadChunk* new_chunk = alloc_joypad_chunk(size);
  memcpy(new_chunk->data, file_data->data, file_data->size);
  new_chunk->size = size;
  new_chunk->prev = new_chunk->next = &buffer->sentinel;
  buffer->sentinel.prev = buffer->sentinel.next = new_chunk;
  *out_buffer = buffer;
  return OK;
  ON_ERROR_RETURN;
}